

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution_test.cpp
# Opt level: O0

void flatbuffers::tests::EvolutionTest(string *tests_data_path)

{
  bool bVar1;
  uint8_t expval;
  Union UVar2;
  Union expval_00;
  Enum expval_01;
  SizeT SVar3;
  int iVar4;
  int32_t iVar5;
  flatbuffers *pfVar6;
  uint8_t *__first;
  uchar *__last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  reference pvVar7;
  size_type_conflict buf_len;
  Root *this;
  TableC *pTVar8;
  TableA *this_00;
  undefined4 extraout_var;
  Struct *this_01;
  Root *this_02;
  undefined4 extraout_var_00;
  Struct *this_03;
  char *pcVar9;
  string *buf_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar10;
  string *local_e28;
  string *local_e10;
  pointer *local_df8;
  bool *local_d28;
  string *local_d10;
  string *local_cf8;
  Root *root_v2_viewed_from_v1;
  Root *root_v1_viewed_from_v2;
  Verifier verifier;
  int i_1;
  uint8_t *buf;
  undefined1 local_c70 [4];
  SizeT bufLen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  undefined1 local_c10 [8];
  string json;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  undefined1 local_b90 [8];
  string schema;
  undefined1 local_b68 [4];
  int i;
  Parser parser;
  undefined1 local_3d8 [8];
  IDLOptions idl_opts;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaries [2];
  string jsonfiles [2];
  string schemas [2];
  int NUM_VERSIONS;
  string *tests_data_path_local;
  
  schemas[1].field_2._12_4_ = 2;
  local_cf8 = (string *)(jsonfiles[1].field_2._M_local_buf + 8);
  do {
    std::__cxx11::string::string(local_cf8);
    local_cf8 = local_cf8 + 0x20;
  } while (local_cf8 != (string *)((long)&schemas[1].field_2 + 8));
  local_d10 = (string *)
              &binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
  do {
    std::__cxx11::string::string(local_d10);
    local_d10 = local_d10 + 0x20;
  } while (local_d10 != (string *)((long)&jsonfiles[1].field_2 + 8));
  local_d28 = &idl_opts.grpc_python_typed_handlers;
  buf_00 = (string *)
           &binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d28);
    local_d28 = (bool *)((long)local_d28 + 0x18);
  } while ((string *)local_d28 != buf_00);
  IDLOptions::IDLOptions((IDLOptions *)local_3d8);
  idl_opts.mini_reflect._1_1_ = idl_opts.mini_reflect._1_1_ | 1;
  Parser::Parser((Parser *)local_b68,(IDLOptions *)local_3d8);
  for (schema.field_2._12_4_ = 0; (int)schema.field_2._12_4_ < 2;
      schema.field_2._12_4_ = schema.field_2._12_4_ + 1) {
    std::operator+(&local_bd0,tests_data_path,"evolution_test/evolution_v");
    NumToString<int>((string *)((long)&json.field_2 + 8),schema.field_2._12_4_ + 1);
    std::operator+(&local_bb0,&local_bd0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&json.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b90,
                   &local_bb0,".fbs");
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::~string((string *)(json.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_bd0);
    pfVar6 = (flatbuffers *)std::__cxx11::string::c_str();
    bVar1 = LoadFile(pfVar6,(char *)0x0,
                     (bool)((char)jsonfiles + '8' + (char)schema.field_2._12_4_ * ' '),buf_00);
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
    ;
    TestEq<bool,bool>(true,bVar1,
                      "\'true\' != \'flatbuffers::LoadFile(schema.c_str(), false, &schemas[i])\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x1b,"");
    std::operator+(&local_c50,tests_data_path,"evolution_test/evolution_v");
    NumToString<int>((string *)local_c70,schema.field_2._12_4_ + 1);
    std::operator+(&local_c30,&local_c50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c10,
                   &local_c30,".json");
    std::__cxx11::string::~string((string *)&local_c30);
    std::__cxx11::string::~string((string *)local_c70);
    std::__cxx11::string::~string((string *)&local_c50);
    pfVar6 = (flatbuffers *)std::__cxx11::string::c_str();
    bVar1 = LoadFile(pfVar6,(char *)0x0,
                     (bool)((char)binaries + '(' + (char)schema.field_2._12_4_ * ' '),
                     (string *)pcVar9);
    TestEq<bool,bool>(true,bVar1,
                      "\'true\' != \'flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i])\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x1e,"");
    pcVar9 = (char *)std::__cxx11::string::c_str();
    bVar1 = Parser::Parse((Parser *)local_b68,pcVar9,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'parser.Parse(schemas[i].c_str())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x20,"");
    pcVar9 = (char *)std::__cxx11::string::c_str();
    bVar1 = Parser::Parse((Parser *)local_b68,pcVar9,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'parser.Parse(jsonfiles[i].c_str())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x21,"");
    SVar3 = FlatBufferBuilderImpl<false>::GetSize
                      ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
    __first = FlatBufferBuilderImpl<false>::GetBufferPointer
                        ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &binaries[(long)(int)schema.field_2._12_4_ + -1].
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)SVar3);
    buf_00 = (string *)(ulong)SVar3;
    __last = __first + (long)buf_00;
    __result = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &binaries[(long)(int)schema.field_2._12_4_ + -1].
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    std::
    copy<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (__first,__last,__result);
    std::__cxx11::string::~string((string *)local_c10);
    std::__cxx11::string::~string((string *)local_b90);
  }
  for (verifier.flex_reuse_tracker_._4_4_ = 0; verifier.flex_reuse_tracker_._4_4_ < 2;
      verifier.flex_reuse_tracker_._4_4_ = verifier.flex_reuse_tracker_._4_4_ + 1) {
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &binaries[(long)verifier.flex_reuse_tracker_._4_4_ + -1].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    buf_len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &binaries[(long)verifier.flex_reuse_tracker_._4_4_ + -1].
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    VerifierTemplate<false>::VerifierTemplate
              ((VerifierTemplate<false> *)&root_v1_viewed_from_v2,pvVar7,buf_len,0x40,1000000,true);
    bVar1 = Evolution::V1::VerifyRootBuffer((Verifier *)&root_v1_viewed_from_v2);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'Evolution::V1::VerifyRootBuffer(verifier)\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x2d,"");
    bVar1 = Evolution::V2::VerifyRootBuffer((Verifier *)&root_v1_viewed_from_v2);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'Evolution::V2::VerifyRootBuffer(verifier)\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x2e,"");
  }
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &idl_opts.grpc_python_typed_handlers);
  this = Evolution::V2::GetRoot(pvVar7);
  pTVar8 = Evolution::V2::Root::k(this);
  TestEq<bool,bool>(true,pTVar8 == (TableC *)0x0,
                    "\'true\' != \'nullptr == root_v1_viewed_from_v2->k()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                    ,0x34,"");
  expval = Evolution::V2::Root::l(this);
  pvVar10 = (void *)0x38;
  TestEq<unsigned_char,int>
            (expval,0x38,"\'root_v1_viewed_from_v2->l()\' != \'56\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
             ,0x36,"");
  this_00 = Evolution::V2::Root::e(this);
  iVar4 = Evolution::V2::TableA::c(this_00,pvVar10,extraout_RDX);
  TestEq<bool,bool>(true,CONCAT44(extraout_var,iVar4) == 0,
                    "\'true\' != \'nullptr == root_v1_viewed_from_v2->e()->c()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                    ,0x38,"");
  pTVar8 = Evolution::V2::Root::c_as_TableC(this);
  TestEq<bool,bool>(true,pTVar8 == (TableC *)0x0,
                    "\'true\' != \'nullptr == root_v1_viewed_from_v2->c_as_TableC()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                    ,0x3a,"");
  UVar2 = Evolution::V2::Root::c_type(this);
  TestEq<bool,bool>(true,UVar2 == TableB,
                    "\'true\' != \'root_v1_viewed_from_v2->c_type() == Evolution::V2::Union::TableB\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                    ,0x3c,"");
  this_01 = Evolution::V2::Root::ff(this);
  iVar5 = Evolution::V2::Struct::a(this_01);
  TestEq<int,int>(iVar5,0x10,"\'root_v1_viewed_from_v2->ff()->a()\' != \'16\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                  ,0x3f,"");
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_02 = Evolution::V1::GetRoot(pvVar7);
  expval_00 = Evolution::V1::Root::c_type(this_02);
  pvVar10 = (void *)0x3;
  TestEq<unsigned_char,int>
            (expval_00,3,"\'static_cast<uint8_t>(root_v2_viewed_from_v1->c_type())\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
             ,0x45,"");
  iVar4 = Evolution::V1::Root::c(this_02,pvVar10,extraout_RDX_00);
  TestEq<bool,bool>(true,CONCAT44(extraout_var_00,iVar4) != 0,
                    "\'nullptr\' == \'root_v2_viewed_from_v1->c()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                    ,0x46,"");
  expval_01 = Evolution::V1::Root::d(this_02);
  TestEq<signed_char,int>
            (expval_01,3,"\'static_cast<int8_t>(root_v2_viewed_from_v1->d())\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
             ,0x49,"");
  iVar5 = Evolution::V1::Root::a(this_02);
  TestEq<int,int>(iVar5,0,"\'root_v2_viewed_from_v1->a()\' != \'0\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                  ,0x4c,"");
  this_03 = Evolution::V1::Root::f(this_02);
  iVar5 = Evolution::V1::Struct::a(this_03);
  TestEq<int,int>(iVar5,0x23,"\'root_v2_viewed_from_v1->f()->a()\' != \'35\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                  ,0x4f,"");
  Parser::~Parser((Parser *)local_b68);
  IDLOptions::~IDLOptions((IDLOptions *)local_3d8);
  local_df8 = &binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
  do {
    local_df8 = local_df8 + -3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_df8);
  } while (local_df8 != (pointer *)&idl_opts.grpc_python_typed_handlers);
  local_e10 = (string *)(jsonfiles[1].field_2._M_local_buf + 8);
  do {
    local_e10 = local_e10 + -0x20;
    std::__cxx11::string::~string(local_e10);
  } while (local_e10 !=
           (string *)
           &binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  local_e28 = (string *)(schemas[1].field_2._M_local_buf + 8);
  do {
    local_e28 = local_e28 + -0x20;
    std::__cxx11::string::~string(local_e28);
  } while (local_e28 != (string *)((long)&jsonfiles[1].field_2 + 8));
  return;
}

Assistant:

void EvolutionTest(const std::string &tests_data_path) {
  // VS10 does not support typed enums, exclude from tests
#if !defined(_MSC_VER) || _MSC_VER >= 1700
  const int NUM_VERSIONS = 2;
  std::string schemas[NUM_VERSIONS];
  std::string jsonfiles[NUM_VERSIONS];
  std::vector<uint8_t> binaries[NUM_VERSIONS];

  flatbuffers::IDLOptions idl_opts;
  idl_opts.lang_to_generate |= flatbuffers::IDLOptions::kBinary;
  flatbuffers::Parser parser(idl_opts);

  // Load all the schema versions and their associated data.
  for (int i = 0; i < NUM_VERSIONS; ++i) {
    std::string schema = tests_data_path + "evolution_test/evolution_v" +
                         flatbuffers::NumToString(i + 1) + ".fbs";
    TEST_ASSERT(flatbuffers::LoadFile(schema.c_str(), false, &schemas[i]));
    std::string json = tests_data_path + "evolution_test/evolution_v" +
                       flatbuffers::NumToString(i + 1) + ".json";
    TEST_ASSERT(flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i]));

    TEST_ASSERT(parser.Parse(schemas[i].c_str()));
    TEST_ASSERT(parser.Parse(jsonfiles[i].c_str()));

    auto bufLen = parser.builder_.GetSize();
    auto buf = parser.builder_.GetBufferPointer();
    binaries[i].reserve(bufLen);
    std::copy(buf, buf + bufLen, std::back_inserter(binaries[i]));
  }

  // Assert that all the verifiers for the different schema versions properly
  // verify any version data.
  for (int i = 0; i < NUM_VERSIONS; ++i) {
    flatbuffers::Verifier verifier(&binaries[i].front(), binaries[i].size());
    TEST_ASSERT(Evolution::V1::VerifyRootBuffer(verifier));
    TEST_ASSERT(Evolution::V2::VerifyRootBuffer(verifier));
  }

  // Test backwards compatibility by reading old data with an evolved schema.
  auto root_v1_viewed_from_v2 = Evolution::V2::GetRoot(&binaries[0].front());
  // field 'k' is new in version 2, so it should be null.
  TEST_ASSERT(nullptr == root_v1_viewed_from_v2->k());
  // field 'l' is new in version 2 with a default of 56.
  TEST_EQ(root_v1_viewed_from_v2->l(), 56);
  // field 'c' of 'TableA' is new in version 2, so it should be null.
  TEST_ASSERT(nullptr == root_v1_viewed_from_v2->e()->c());
  // 'TableC' was added to field 'c' union in version 2, so it should be null.
  TEST_ASSERT(nullptr == root_v1_viewed_from_v2->c_as_TableC());
  // The field 'c' union should be of type 'TableB' regardless of schema version
  TEST_ASSERT(root_v1_viewed_from_v2->c_type() == Evolution::V2::Union::TableB);
  // The field 'f' was renamed to 'ff' in version 2, it should still be
  // readable.
  TEST_EQ(root_v1_viewed_from_v2->ff()->a(), 16);

  // Test forwards compatibility by reading new data with an old schema.
  auto root_v2_viewed_from_v1 = Evolution::V1::GetRoot(&binaries[1].front());
  // The field 'c' union in version 2 is a new table (index = 3) and should
  // still be accessible, but not interpretable.
  TEST_EQ(static_cast<uint8_t>(root_v2_viewed_from_v1->c_type()), 3);
  TEST_NOTNULL(root_v2_viewed_from_v1->c());
  // The field 'd' enum in verison 2 has new members and should still be
  // accessible, but not interpretable.
  TEST_EQ(static_cast<int8_t>(root_v2_viewed_from_v1->d()), 3);
  // The field 'a' in version 2 is deprecated and should return the default
  // value (0) instead of the value stored in the in the buffer (42).
  TEST_EQ(root_v2_viewed_from_v1->a(), 0);
  // The field 'ff' was originally named 'f' in version 1, it should still be
  // readable.
  TEST_EQ(root_v2_viewed_from_v1->f()->a(), 35);
#endif
}